

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O2

QDebug __thiscall
QtPrivate::printSequentialContainer<QList<QWidget*>>
          (QtPrivate *this,QDebug debug,char *which,QList<QWidget_*> *c)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  QDebug *pQVar4;
  QWidget **ppQVar5;
  QDebug debug_00;
  QWidget **ppQVar6;
  QWidget *widget;
  long in_FS_OFFSET;
  Stream *local_60;
  Stream local_58 [8];
  long local_50;
  Stream local_48 [8];
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)debug.stream);
  *(undefined1 *)(*(long *)debug.stream + 0x30) = 0;
  pQVar4 = QDebug::operator<<((QDebug *)debug.stream,which);
  QDebug::operator<<(pQVar4,'(');
  ppQVar6 = (c->d).ptr;
  lVar2 = (c->d).size;
  ppQVar5 = ppQVar6 + lVar2;
  if (lVar2 == 0) goto LAB_0030c48a;
  local_50 = *(long *)debug.stream;
  widget = (QWidget *)&local_50;
  *(int *)(local_50 + 0x28) = *(int *)(local_50 + 0x28) + 1;
  debug_00.stream = local_48;
  while( true ) {
    ::operator<<(debug_00,widget);
    QDebug::~QDebug((QDebug *)debug_00.stream);
    QDebug::~QDebug((QDebug *)widget);
    ppQVar6 = ppQVar6 + 1;
LAB_0030c48a:
    if (ppQVar6 == ppQVar5) break;
    pQVar4 = QDebug::operator<<((QDebug *)debug.stream,", ");
    local_60 = pQVar4->stream;
    widget = (QWidget *)&local_60;
    *(int *)(local_60 + 0x28) = *(int *)(local_60 + 0x28) + 1;
    debug_00.stream = local_58;
  }
  QDebug::operator<<((QDebug *)debug.stream,')');
  uVar3 = *(undefined8 *)debug.stream;
  *(undefined8 *)debug.stream = 0;
  *(undefined8 *)this = uVar3;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)(Stream *)this;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}